

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  cmCommandContext *lfcc;
  const_reference ppcVar1;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *this_local;
  
  local_18 = this;
  this_local = (cmMakefile *)__return_storage_ptr__;
  ppcVar1 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                      (&this->ContextStack);
  lfcc = *ppcVar1;
  cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_38,&this->StateSnapshot);
  cmListFileContext::FromCommandContext(__return_storage_ptr__,lfcc,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  return cmListFileContext::FromCommandContext(
        *this->ContextStack.back(),
        this->StateSnapshot.GetExecutionListFile());
}